

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstracttextdocumentlayout.cpp
# Opt level: O0

void QAbstractTextDocumentLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  qreal *pqVar1;
  bool bVar2;
  int iVar3;
  QtMocHelpers *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  QAbstractTextDocumentLayout *in_RDI;
  long in_FS_OFFSET;
  QSizeF QVar4;
  int _r;
  QAbstractTextDocumentLayout *_t;
  QSizeF _r_1;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  QAbstractTextDocumentLayout *in_stack_ffffffffffffff50;
  qreal local_38;
  qreal local_30;
  QRectF local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      update(in_stack_ffffffffffffff50,
             (QRectF *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      break;
    case 1:
      QRectF::QRectF(&local_28,0.0,0.0,1000000000.0,1000000000.0);
      update(in_RDI,(QRectF *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      break;
    case 2:
      updateBlock(in_stack_ffffffffffffff50,
                  (QTextBlock *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      break;
    case 3:
      documentSizeChanged(in_stack_ffffffffffffff50,
                          (QSizeF *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      break;
    case 4:
      pageCountChanged((QAbstractTextDocumentLayout *)0x6f8e48,in_stack_ffffffffffffff4c);
      break;
    case 5:
      d_func((QAbstractTextDocumentLayout *)0x6f8e57);
      iVar3 = QAbstractTextDocumentLayoutPrivate::_q_dynamicPageCountSlot
                        ((QAbstractTextDocumentLayoutPrivate *)0x6f8e5f);
      if (*(long *)in_RCX != 0) {
        **(int **)in_RCX = iVar3;
      }
      break;
    case 6:
      d_func((QAbstractTextDocumentLayout *)0x6f8ea6);
      QVar4 = QAbstractTextDocumentLayoutPrivate::_q_dynamicDocumentSizeSlot
                        ((QAbstractTextDocumentLayoutPrivate *)0x6f8eae);
      if (*(long *)in_RCX != 0) {
        pqVar1 = *(qreal **)in_RCX;
        local_38 = QVar4.wd;
        *pqVar1 = local_38;
        local_30 = QVar4.ht;
        pqVar1[1] = local_30;
      }
    }
  }
  if ((((in_ESI == 5) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QAbstractTextDocumentLayout::*)(QRectF_const&)>
                          (in_RCX,(void **)update,0,0), !bVar2)) &&
      (bVar2 = QtMocHelpers::indexOfMethod<void(QAbstractTextDocumentLayout::*)(QTextBlock_const&)>
                         (in_RCX,(void **)updateBlock,0,2), !bVar2)) &&
     (bVar2 = QtMocHelpers::indexOfMethod<void(QAbstractTextDocumentLayout::*)(QSizeF_const&)>
                        (in_RCX,(void **)documentSizeChanged,0,3), !bVar2)) {
    QtMocHelpers::indexOfMethod<void(QAbstractTextDocumentLayout::*)(int)>
              (in_RCX,(void **)pageCountChanged,0,4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractTextDocumentLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractTextDocumentLayout *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->update((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 1: _t->update(); break;
        case 2: _t->updateBlock((*reinterpret_cast< std::add_pointer_t<QTextBlock>>(_a[1]))); break;
        case 3: _t->documentSizeChanged((*reinterpret_cast< std::add_pointer_t<QSizeF>>(_a[1]))); break;
        case 4: _t->pageCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: { int _r = _t->d_func()->_q_dynamicPageCountSlot();
            if (_a[0]) *reinterpret_cast< int*>(_a[0]) = std::move(_r); }  break;
        case 6: { QSizeF _r = _t->d_func()->_q_dynamicDocumentSizeSlot();
            if (_a[0]) *reinterpret_cast< QSizeF*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QRectF & )>(_a, &QAbstractTextDocumentLayout::update, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QTextBlock & )>(_a, &QAbstractTextDocumentLayout::updateBlock, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(const QSizeF & )>(_a, &QAbstractTextDocumentLayout::documentSizeChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractTextDocumentLayout::*)(int )>(_a, &QAbstractTextDocumentLayout::pageCountChanged, 4))
            return;
    }
}